

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

void __thiscall Rml::Element::AddBox(Element *this,Box *box,Vector2f offset)

{
  pointer *ppPVar1;
  iterator __position;
  PositionedBox local_58;
  
  local_58.box.area_edges[2]._8_8_ = *(undefined8 *)(box->area_edges[2] + 2);
  local_58.box.content = box->content;
  local_58.box.area_edges[0]._0_8_ = *(undefined8 *)box->area_edges[0];
  local_58.box.area_edges[0]._8_8_ = *(undefined8 *)(box->area_edges[0] + 2);
  local_58.box.area_edges[1]._0_8_ = *(undefined8 *)box->area_edges[1];
  local_58.box.area_edges[1]._8_8_ = *(undefined8 *)(box->area_edges[1] + 2);
  local_58.box.area_edges[2]._0_8_ = *(undefined8 *)box->area_edges[2];
  __position._M_current =
       (this->additional_boxes).
       super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.offset = offset;
  if (__position._M_current ==
      (this->additional_boxes).
      super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>::
    _M_realloc_insert<Rml::Element::PositionedBox>(&this->additional_boxes,__position,&local_58);
  }
  else {
    *(undefined8 *)(((__position._M_current)->box).area_edges[2] + 2) =
         local_58.box.area_edges[2]._8_8_;
    (__position._M_current)->offset = offset;
    *(undefined8 *)(((__position._M_current)->box).area_edges[1] + 2) =
         local_58.box.area_edges[1]._8_8_;
    *(undefined8 *)((__position._M_current)->box).area_edges[2] = local_58.box.area_edges[2]._0_8_;
    *(undefined8 *)(((__position._M_current)->box).area_edges[0] + 2) =
         local_58.box.area_edges[0]._8_8_;
    *(undefined8 *)((__position._M_current)->box).area_edges[1] = local_58.box.area_edges[1]._0_8_;
    ((__position._M_current)->box).content = local_58.box.content;
    *(undefined8 *)((__position._M_current)->box).area_edges[0] = local_58.box.area_edges[0]._0_8_;
    ppPVar1 = &(this->additional_boxes).
               super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppPVar1 = *ppPVar1 + 1;
  }
  Box::~Box(&local_58.box);
  (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0xc])(this);
  ElementBackgroundBorder::DirtyBackground(&this->meta->background_border);
  ElementBackgroundBorder::DirtyBorder(&this->meta->background_border);
  ElementEffects::DirtyEffectsData(&this->meta->effects);
  return;
}

Assistant:

void Element::AddBox(const Box& box, Vector2f offset)
{
	additional_boxes.emplace_back(PositionedBox{box, offset});
	OnResize();
	meta->background_border.DirtyBackground();
	meta->background_border.DirtyBorder();
	meta->effects.DirtyEffectsData();
}